

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall Blip_Impulse_::scale_impulse(Blip_Impulse_ *this,int unit,imp_t *imp_in)

{
  undefined2 *puVar1;
  long lVar2;
  int iVar3;
  undefined2 *in_RDX;
  int in_ESI;
  long in_RDI;
  int nn_1;
  imp_t *rev;
  long a;
  int nn;
  int error;
  int n;
  imp_t *fimp;
  imp_t *imp;
  long offset;
  int local_54;
  undefined2 *local_50;
  int local_3c;
  int local_38;
  int local_34;
  ushort *local_30;
  undefined2 *local_28;
  
  local_30 = *(ushort **)(in_RDI + 0x28);
  local_34 = *(int *)(in_RDI + 0x38) / 2 + 1;
  local_28 = in_RDX;
  while (local_34 != 0) {
    local_3c = *(int *)(in_RDI + 0x30);
    local_38 = in_ESI;
    while (local_3c != 0) {
      lVar2 = (long)((ulong)*local_30 * (long)in_ESI +
                    (long)in_ESI * 0x8000 + (long)in_ESI * -0x4000 + 0x4000) >> 0xf;
      local_38 = local_38 - ((int)lVar2 - in_ESI);
      *local_28 = (short)lVar2;
      local_3c = local_3c + -1;
      local_30 = local_30 + 1;
      local_28 = local_28 + 1;
    }
    iVar3 = -*(int *)(in_RDI + 0x30) / 2 + -1;
    local_28[iVar3] = local_28[iVar3] + (short)local_38;
    local_34 = local_34 + -1;
  }
  if (2 < *(int *)(in_RDI + 0x38)) {
    local_54 = (*(int *)(in_RDI + 0x38) / 2 + -1) * *(int *)(in_RDI + 0x30);
    puVar1 = local_28 + -(long)*(int *)(in_RDI + 0x30);
    while (local_50 = puVar1 + -1, local_54 = local_54 + -1, local_54 != 0) {
      *local_28 = puVar1[-2];
      local_28 = local_28 + 1;
      puVar1 = local_50;
    }
    *local_28 = (short)in_ESI;
    local_28 = local_28 + 1;
  }
  *local_28 = (short)in_ESI;
  memcpy(local_28 + 1,in_RDX,(long)(*(int *)(in_RDI + 0x38) * *(int *)(in_RDI + 0x30) + -1) << 1);
  return;
}

Assistant:

void Blip_Impulse_::scale_impulse( int unit, imp_t* imp_in ) const
{
	long offset = ((long) unit << impulse_bits) - impulse_offset * unit +
			(1 << (impulse_bits - 1));
	imp_t* imp = imp_in;
	imp_t* fimp = impulse;
	for ( int n = res / 2 + 1; n--; )
	{
		int error = unit;
		for ( int nn = width; nn--; )
		{
			long a = ((long) *fimp++ * unit + offset) >> impulse_bits;
			error -= a - unit;
			*imp++ = (imp_t) a;
		}
		
		// add error to middle
		imp [-width / 2 - 1] += (imp_t) error;
	}
	
	if ( res > 2 ) {
		// second half is mirror-image
		const imp_t* rev = imp - width - 1;
		for ( int nn = (res / 2 - 1) * width - 1; nn--; )
			*imp++ = *--rev;
		*imp++ = (imp_t) unit;
	}
	
	// copy to odd offset
	*imp++ = (imp_t) unit;
	memcpy( imp, imp_in, (res * width - 1) * sizeof *imp );
}